

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

void mtree_indent(mtree_writer *mtree)

{
  archive_string *as;
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *__s;
  int iVar9;
  ulong uVar10;
  char *__s_00;
  bool bVar11;
  
  iVar4 = 0;
  if (mtree->classic == 0) {
    uVar1 = 0;
  }
  else if (mtree->indent == 0) {
    uVar1 = (uint)(mtree->depth != 0) << 2;
  }
  else {
    iVar4 = mtree->depth << 2;
    uVar1 = 0;
  }
  __s_00 = (mtree->ebuf).s;
  __s = __s_00 + -1;
  do {
    pcVar8 = __s + 1;
    __s = __s + 1;
  } while (*pcVar8 == ' ');
  iVar6 = 0;
  iVar9 = iVar4 + uVar1;
  if ((int)(iVar4 + uVar1) < 1) {
    iVar9 = iVar6;
  }
  as = &mtree->buf;
  iVar7 = iVar4 + 0x10;
  if (iVar4 + 0x10 < 1) {
    iVar7 = iVar6;
  }
LAB_00148557:
  pcVar8 = (char *)0x0;
  while( true ) {
    pcVar2 = strchr(__s,0x20);
    if (pcVar2 == (char *)0x0) {
      if (iVar6 == 0) {
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
          archive_strappend_char(as,' ');
        }
        archive_strcat(as,__s_00);
        sVar3 = strlen(__s_00);
        __s_00 = __s_00 + sVar3;
      }
      if ((pcVar8 != (char *)0x0) && (sVar3 = strlen(__s_00), 0x3e < sVar3 + (long)iVar4)) {
        archive_strncat(as,__s_00,(long)pcVar8 - (long)__s_00);
        archive_strncat(as," \\\n",3);
        while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
          archive_strappend_char(as,' ');
        }
        __s_00 = pcVar8 + 1;
      }
      archive_strcat(as,__s_00);
      (mtree->ebuf).length = 0;
      return;
    }
    iVar5 = iVar9;
    if (iVar6 == 0) goto LAB_0014859e;
    if (0x3e < (long)(pcVar2 + ((long)iVar4 - (long)__s_00))) break;
    __s = pcVar2 + 1;
    iVar6 = 1;
    pcVar8 = pcVar2;
  }
  if (pcVar8 != (char *)0x0) {
    pcVar2 = pcVar8;
  }
  archive_strncat(as,__s_00,(long)pcVar2 - (long)__s_00);
  archive_strncat(as," \\\n",3);
  iVar6 = iVar7;
  while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
    archive_strappend_char(as,' ');
  }
  goto LAB_00148662;
LAB_0014859e:
  while (iVar5 != 0) {
    archive_strappend_char(as,' ');
    iVar5 = iVar5 + -1;
  }
  archive_strncat(as,__s_00,(long)pcVar2 - (long)__s_00);
  uVar10 = ((long)pcVar2 - (long)__s_00) + (ulong)uVar1;
  if ((long)uVar10 < 0x10) {
    for (; (int)uVar10 < 0x10; uVar10 = (ulong)((int)uVar10 + 1)) {
      archive_strappend_char(as,' ');
    }
  }
  else {
    archive_strncat(as," \\\n",3);
    iVar6 = iVar7;
    while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
      archive_strappend_char(as,' ');
    }
  }
LAB_00148662:
  __s_00 = pcVar2 + 1;
  iVar6 = 1;
  __s = __s_00;
  goto LAB_00148557;
}

Assistant:

static void
mtree_indent(struct mtree_writer *mtree)
{
	int i, fn, nd, pd;
	const char *r, *s, *x;

	if (mtree->classic) {
		if (mtree->indent) {
			nd = 0;
			pd = mtree->depth * 4;
		} else {
			nd = mtree->depth?4:0;
			pd = 0;
		}
	} else
		nd = pd = 0;
	fn = 1;
	s = r = mtree->ebuf.s;
	x = NULL;
	while (*r == ' ')
		r++;
	while ((r = strchr(r, ' ')) != NULL) {
		if (fn) {
			fn = 0;
			for (i = 0; i < nd + pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
			archive_strncat(&mtree->buf, s, r - s);
			if (nd + (r -s) > INDENTNAMELEN) {
				archive_strncat(&mtree->buf, " \\\n", 3);
				for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
					archive_strappend_char(&mtree->buf, ' ');
			} else {
				for (i = (int)(r -s + nd);
				    i < (INDENTNAMELEN + 1); i++)
					archive_strappend_char(&mtree->buf, ' ');
			}
			s = ++r;
			x = NULL;
			continue;
		}
		if (pd + (r - s) <= MAXLINELEN - 3 - INDENTNAMELEN)
			x = r++;
		else {
			if (x == NULL)
				x = r;
			archive_strncat(&mtree->buf, s, x - s);
			archive_strncat(&mtree->buf, " \\\n", 3);
			for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
				archive_strappend_char(&mtree->buf, ' ');
			s = r = ++x;
			x = NULL;
		}
	}
	if (fn) {
		for (i = 0; i < nd + pd; i++)
			archive_strappend_char(&mtree->buf, ' ');
		archive_strcat(&mtree->buf, s);
		s += strlen(s);
	}
	if (x != NULL && pd + strlen(s) > MAXLINELEN - 3 - INDENTNAMELEN) {
		/* Last keyword is longer. */
		archive_strncat(&mtree->buf, s, x - s);
		archive_strncat(&mtree->buf, " \\\n", 3);
		for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
			archive_strappend_char(&mtree->buf, ' ');
		s = ++x;
	}
	archive_strcat(&mtree->buf, s);
	archive_string_empty(&mtree->ebuf);
}